

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

int re_compile_and_search
              (re_context *ctx,char *pattern,size_t patlen,char *searchstr,size_t searchlen,
              int *result_len)

{
  char *__string;
  re_status_t rVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  re_machine machine;
  
  rVar1 = re_compile(ctx,pattern,patlen,&machine);
  if (rVar1 == RE_STATUS_SUCCESS) {
    re_save_search_str(ctx,searchstr,searchlen);
    uVar4 = 0;
    memset(ctx->regs,0,0xa0);
    __string = ctx->strbuf;
    uVar5 = ctx->curlen;
    uVar3 = 0;
    if (0 < (int)uVar5) {
      uVar3 = uVar5 & 0xffffffff;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = re_match((re_pattern_buffer *)ctx,__string,(int)__string + (int)uVar4,(int)uVar5,
                       (re_registers *)&machine);
      if (-1 < iVar2) {
        *result_len = iVar2;
        return (int)uVar4;
      }
      uVar5 = uVar5 - 1;
    }
  }
  return -1;
}

Assistant:

int re_compile_and_search(re_context *ctx,
                          const char *pattern, size_t patlen,
                          const char *searchstr, size_t searchlen,
                          int *result_len)
{
    re_machine machine;
    
    /* compile the expression - return failure if we get an error */
    if (re_compile(ctx, pattern, patlen, &machine) != RE_STATUS_SUCCESS)
        return -1;

    /* save the search string in our internal buffer */
    re_save_search_str(ctx, searchstr, searchlen);

    /* clear the group registers */
    memset(ctx->regs, 0, sizeof(ctx->regs));

    /* 
     *   search for the pattern in our copy of the string - use the copy
     *   so that the group registers stay valid even if the caller
     *   deallocates the original string after we return
     */
    return re_search(ctx, ctx->strbuf, ctx->curlen, &machine,
                     ctx->regs, result_len);
}